

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_server.h
# Opt level: O1

void __thiscall
blcl::net::server_interface<MsgType>::~server_interface(server_interface<MsgType> *this)

{
  service_registry *psVar1;
  _func_int ***ppp_Var2;
  service *psVar3;
  
  this->_vptr_server_interface = (_func_int **)&PTR__server_interface_001204b8;
  stop(this);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  ~io_object_impl(&(this->asio_acceptor_).impl_);
  if ((this->ctx_thread_)._M_id._M_thread != 0) {
    std::terminate();
  }
  for (psVar3 = ((this->context_).super_execution_context.service_registry_)->first_service_;
      psVar3 != (service *)0x0; psVar3 = psVar3->next_) {
    (*psVar3->_vptr_service[2])(psVar3);
  }
  psVar1 = (this->context_).super_execution_context.service_registry_;
  psVar3 = psVar1->first_service_;
  while (psVar3 != (service *)0x0) {
    ppp_Var2 = &psVar3->_vptr_service;
    psVar3 = psVar3->next_;
    (*(*ppp_Var2)[1])();
    psVar1->first_service_ = psVar3;
  }
  psVar1 = (this->context_).super_execution_context.service_registry_;
  if (psVar1 != (service_registry *)0x0) {
    pthread_mutex_destroy((pthread_mutex_t *)&psVar1->mutex_);
    operator_delete(psVar1,0x40);
  }
  std::
  deque<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  ::~deque(&this->connections_);
  tsqueue<blcl::net::owned_message<MsgType>_>::~tsqueue(&this->incoming_messages_);
  return;
}

Assistant:

virtual ~server_interface() {
            stop();
        }